

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::insert
          (QMovableArrayOps<QUrl> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QUrl **ppQVar1;
  qsizetype *pqVar2;
  qsizetype inserts;
  QUrl *this_00;
  qsizetype qVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QUrl copy;
  QUrl local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_40,t);
  bVar4 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size != 0;
  QArrayDataPointer<QUrl>::detachAndGrow
            ((QArrayDataPointer<QUrl> *)this,(uint)(i == 0 && bVar4),n,(QUrl **)0x0,
             (QArrayDataPointer<QUrl> *)0x0);
  if (i == 0 && bVar4) {
    if (n != 0) {
      do {
        QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + -1,
                   &local_40);
        ppQVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    this_00 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + i;
    memmove(this_00 + n,this_00,
            ((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size - i) * 8);
    if (n != 0) {
      qVar3 = n;
      do {
        QUrl::QUrl(this_00,&local_40);
        this_00 = this_00 + 1;
        qVar3 = qVar3 + -1;
      } while (qVar3 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
    *pqVar2 = *pqVar2 + n;
  }
  QUrl::~QUrl(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }